

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O3

void load_GL_KHR_robustness(GLADloadproc load)

{
  if (GLAD_GL_KHR_robustness != 0) {
    glad_glGetGraphicsResetStatus =
         (PFNGLGETGRAPHICSRESETSTATUSPROC)(*load)("glGetGraphicsResetStatus");
    glad_glReadnPixels = (PFNGLREADNPIXELSPROC)(*load)("glReadnPixels");
    glad_glGetnUniformfv = (PFNGLGETNUNIFORMFVPROC)(*load)("glGetnUniformfv");
    glad_glGetnUniformiv = (PFNGLGETNUNIFORMIVPROC)(*load)("glGetnUniformiv");
    glad_glGetnUniformuiv = (PFNGLGETNUNIFORMUIVPROC)(*load)("glGetnUniformuiv");
    glad_glGetGraphicsResetStatusKHR =
         (PFNGLGETGRAPHICSRESETSTATUSKHRPROC)(*load)("glGetGraphicsResetStatusKHR");
    glad_glReadnPixelsKHR = (PFNGLREADNPIXELSKHRPROC)(*load)("glReadnPixelsKHR");
    glad_glGetnUniformfvKHR = (PFNGLGETNUNIFORMFVKHRPROC)(*load)("glGetnUniformfvKHR");
    glad_glGetnUniformivKHR = (PFNGLGETNUNIFORMIVKHRPROC)(*load)("glGetnUniformivKHR");
    glad_glGetnUniformuivKHR = (PFNGLGETNUNIFORMUIVKHRPROC)(*load)("glGetnUniformuivKHR");
  }
  return;
}

Assistant:

static void load_GL_KHR_robustness(GLADloadproc load) {
	if(!GLAD_GL_KHR_robustness) return;
	glad_glGetGraphicsResetStatus = (PFNGLGETGRAPHICSRESETSTATUSPROC)load("glGetGraphicsResetStatus");
	glad_glReadnPixels = (PFNGLREADNPIXELSPROC)load("glReadnPixels");
	glad_glGetnUniformfv = (PFNGLGETNUNIFORMFVPROC)load("glGetnUniformfv");
	glad_glGetnUniformiv = (PFNGLGETNUNIFORMIVPROC)load("glGetnUniformiv");
	glad_glGetnUniformuiv = (PFNGLGETNUNIFORMUIVPROC)load("glGetnUniformuiv");
	glad_glGetGraphicsResetStatusKHR = (PFNGLGETGRAPHICSRESETSTATUSKHRPROC)load("glGetGraphicsResetStatusKHR");
	glad_glReadnPixelsKHR = (PFNGLREADNPIXELSKHRPROC)load("glReadnPixelsKHR");
	glad_glGetnUniformfvKHR = (PFNGLGETNUNIFORMFVKHRPROC)load("glGetnUniformfvKHR");
	glad_glGetnUniformivKHR = (PFNGLGETNUNIFORMIVKHRPROC)load("glGetnUniformivKHR");
	glad_glGetnUniformuivKHR = (PFNGLGETNUNIFORMUIVKHRPROC)load("glGetnUniformuivKHR");
}